

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O2

schema_file * __thiscall
nlohmann::json_schema::root_schema::get_or_create_file(root_schema *this,string *loc)

{
  bool bVar1;
  iterator __pos;
  schema_file local_128;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_schema::root_schema::schema_file>
  local_b0;
  
  __pos = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_schema::root_schema::schema_file>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_schema::root_schema::schema_file>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_schema::root_schema::schema_file>_>_>
          ::lower_bound(&(this->files_)._M_t,loc);
  if ((_Rb_tree_header *)__pos._M_node != &(this->files_)._M_t._M_impl.super__Rb_tree_header) {
    bVar1 = std::operator<(loc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (__pos._M_node + 1));
    if (!bVar1) goto LAB_00117d7e;
  }
  local_128.schemas._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_128.schemas._M_t._M_impl.super__Rb_tree_header._M_header;
  local_128.schemas._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128.schemas._M_t._M_impl._0_8_ = 0;
  local_128.schemas._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128.schemas._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_128.unresolved._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_128.unresolved._M_t._M_impl.super__Rb_tree_header._M_header;
  local_128.schemas._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128.unresolved._M_t._M_impl._0_8_ = 0;
  local_128.unresolved._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128.unresolved._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_128.unresolved._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128.unresolved._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128.schemas._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_128.schemas._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_128.unresolved._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_128.unresolved._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_128.unknown_keywords,(nullptr_t)0x0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_schema::root_schema::schema_file>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_schema::root_schema::schema_file,_true>
            (&local_b0,loc,&local_128);
  __pos = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_schema::root_schema::schema_file>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_schema::root_schema::schema_file>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_schema::root_schema::schema_file>>>
          ::
          _M_insert_unique_<std::pair<std::__cxx11::string_const,nlohmann::json_schema::root_schema::schema_file>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_schema::root_schema::schema_file>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_schema::root_schema::schema_file>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_schema::root_schema::schema_file>>>
                      *)&this->files_,__pos._M_node,&local_b0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_schema::root_schema::schema_file>
  ::~pair(&local_b0);
  schema_file::~schema_file(&local_128);
LAB_00117d7e:
  return (schema_file *)(__pos._M_node + 2);
}

Assistant:

schema_file &get_or_create_file(const std::string &loc)
	{
		auto file = files_.lower_bound(loc);
		if (file != files_.end() && !(files_.key_comp()(loc, file->first)))
			return file->second;
		else
			return files_.insert(file, {loc, {}})->second;
	}